

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void prvTidypushMemory(TidyDocImpl *doc,TidyParserMemory data)

{
  uint *puVar1;
  uint uVar2;
  TidyParserMemory *pTVar3;
  TidyParserMemory *pTVar4;
  long lVar5;
  
  uVar2 = (doc->stack).size;
  if ((doc->stack).top == uVar2 - 1) {
    pTVar4 = (TidyParserMemory *)(*doc->allocator->vtbl->alloc)(doc->allocator,(ulong)uVar2 * 0x60);
    memcpy(pTVar4,(doc->stack).content,(long)(doc->stack).top * 0x30 + 0x30);
    (*doc->allocator->vtbl->free)(doc->allocator,(doc->stack).content);
    (doc->stack).content = pTVar4;
    puVar1 = &(doc->stack).size;
    *puVar1 = *puVar1 << 1;
  }
  lVar5 = (long)(doc->stack).top + 1;
  (doc->stack).top = (int)lVar5;
  pTVar4 = (doc->stack).content;
  pTVar3 = pTVar4 + lVar5;
  pTVar3->mode = data.mode;
  pTVar3->register_1 = data.register_1;
  *(undefined8 *)(&pTVar3->mode + 2) = data._40_8_;
  pTVar4[lVar5].reentry_node = data.reentry_node;
  (&pTVar4[lVar5].reentry_node)[1] = (Node *)data._24_8_;
  pTVar4[lVar5].identity = data.identity;
  pTVar4[lVar5].original_node = data.original_node;
  return;
}

Assistant:

void TY_(pushMemory)( TidyDocImpl* doc, TidyParserMemory data )
{
    if ( doc->stack.top == doc->stack.size - 1 )
        growParserStack( doc );

    doc->stack.top++;
    
    doc->stack.content[doc->stack.top] = data;
    DEBUG_LOG(SPRTF("\n"
                    "-->PUSH original: %s @ %p\n"
                    "         reentry: %s @ %p\n"
                    "     stack depth: %lu @ %p\n"
                    "            mode: %u\n"
                    "      register 1: %i\n"
                    "      register 2: %i\n\n",
                    data.original_node ? data.original_node->element : "none", data.original_node,
                    data.reentry_node ? data.reentry_node->element : "none", data.reentry_node,
                    doc->stack.top, &doc->stack.content[doc->stack.top],
                    data.mode,
                    data.register_1,
                    data.register_2
                    ));
}